

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::Ok> *
wasm::WATParser::makeAtomicWait<wasm::WATParser::NullCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,NullCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,Type type)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  undefined1 local_b8 [8];
  MaybeResult<wasm::Ok> mem;
  Result<wasm::Ok> arg;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  undefined1 local_48 [8];
  Result<wasm::Ok> _val_1;
  
  maybeMemidx<wasm::WATParser::NullCtx>((MaybeResult<wasm::Ok> *)local_b8,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
             ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
             (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_b8);
  if (arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>
      .super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
      _M_u._24_1_ == '\x02') {
    puVar1 = (undefined1 *)
             ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
    local_48 = (undefined1  [8])puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,
               mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_,
               arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
               mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_);
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
    if (local_48 == (undefined1  [8])puVar1) {
      *puVar2 = CONCAT71(_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                         _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_48;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           CONCAT71(_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
         _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    local_48 = (undefined1  [8])puVar1;
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                      ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                      ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    Lexer::takeOffset(&ctx->in);
    Lexer::takeAlign(&ctx->in);
    arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _M_u._24_1_ = 0;
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_48,
               (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
               ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>
      .super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
      _32_8_ = &local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),local_48,
                 (undefined1 *)
                 (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_48));
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
      if ((undefined1 *)
          arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == &local_58) {
        *puVar2 = CONCAT71(uStack_57,local_58);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_50;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
             arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             CONCAT71(uStack_57,local_58);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_60;
      local_58 = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>
      .super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
      _32_8_ = &local_58;
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
               ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeAtomicWait(Ctx& ctx,
                        Index pos,
                        const std::vector<Annotation>& annotations,
                        Type type) {
  auto mem = maybeMemidx(ctx);
  CHECK_ERR(mem);
  auto arg = memarg(ctx, type == Type::i32 ? 4 : 8);
  CHECK_ERR(arg);
  return ctx.makeAtomicWait(pos, annotations, type, mem.getPtr(), *arg);
}